

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError MuxImageGetNth(WebPMuxImage **wpi_list,uint32_t nth,WebPMuxImage **wpi)

{
  WebPMuxError WVar1;
  WebPMuxImage *pWVar2;
  WebPMuxImage *pWVar3;
  int iVar4;
  
  pWVar3 = *wpi_list;
  if (nth == 0) {
    if (pWVar3 == (WebPMuxImage *)0x0) {
      return WEBP_MUX_NOT_FOUND;
    }
    nth = 0;
    pWVar2 = pWVar3;
    do {
      nth = nth + 1;
      pWVar2 = pWVar2->next;
    } while (pWVar2 != (WebPMuxImage *)0x0);
  }
  WVar1 = WEBP_MUX_NOT_FOUND;
  if (pWVar3 != (WebPMuxImage *)0x0) {
    if (nth != 1) {
      iVar4 = nth - 1;
      do {
        pWVar3 = pWVar3->next;
        if (pWVar3 == (WebPMuxImage *)0x0) {
          return WEBP_MUX_NOT_FOUND;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    *wpi = pWVar3;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

static int SearchImageToGetOrDelete(WebPMuxImage** wpi_list, uint32_t nth,
                                    WebPMuxImage*** const location) {
  uint32_t count = 0;
  assert(wpi_list);
  *location = wpi_list;

  if (nth == 0) {
    nth = MuxImageCount(*wpi_list, WEBP_CHUNK_NIL);
    if (nth == 0) return 0;  // Not found.
  }

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    ++count;
    if (count == nth) return 1;  // Found.
    wpi_list = &cur_wpi->next;
    *location = wpi_list;
  }
  return 0;  // Not found.
}